

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::TabItemLabelAndCloseButton
               (ImDrawList *draw_list,ImRect *bb,ImGuiTabItemFlags flags,ImVec2 frame_padding,
               char *label,ImGuiID tab_id,ImGuiID close_button_id,bool is_contents_visible)

{
  ImVec2 text;
  bool bVar1;
  float fVar2;
  float local_f8;
  float ellipsis_max_x;
  float local_d0;
  undefined1 local_cc [4];
  float close_button_sz;
  ImGuiItemHoveredDataBackup last_item_backup;
  bool close_button_visible;
  float fStack_9c;
  bool close_button_pressed;
  ImRect text_ellipsis_clip_bb;
  ImVec2 local_88;
  ImVec2 local_80;
  ImVec2 unsaved_marker_pos;
  undefined1 local_70 [8];
  ImRect text_pixel_clip_bb;
  char *TAB_UNSAVED_MARKER;
  ImVec2 label_size;
  ImGuiContext *g;
  bool is_contents_visible_local;
  ImGuiID close_button_id_local;
  ImGuiID tab_id_local;
  char *label_local;
  ImGuiTabItemFlags flags_local;
  ImRect *bb_local;
  ImDrawList *draw_list_local;
  float fStack_10;
  ImVec2 frame_padding_local;
  
  label_size = (ImVec2)GImGui;
  unique0x100004b8 = frame_padding;
  TAB_UNSAVED_MARKER = (char *)CalcTextSize(label,(char *)0x0,true,-1.0);
  fVar2 = ImRect::GetWidth(bb);
  if (fVar2 <= 1.0) {
    frame_padding_local.x._3_1_ = false;
  }
  else {
    text_pixel_clip_bb.Max = (ImVec2)((long)" *Inactive*" + 10);
    ImRect::ImRect((ImRect *)local_70,(bb->Min).x + draw_list_local._4_4_,(bb->Min).y + fStack_10,
                   (bb->Max).x - draw_list_local._4_4_,(bb->Max).y);
    if ((flags & 1U) != 0) {
      unsaved_marker_pos = CalcTextSize((char *)text_pixel_clip_bb.Max,(char *)0x0,false,-1.0);
      text_pixel_clip_bb.Min.x = text_pixel_clip_bb.Min.x - unsaved_marker_pos.x;
      fVar2 = ImMin<float>((bb->Min).x + draw_list_local._4_4_ + TAB_UNSAVED_MARKER._0_4_ + 2.0,
                           text_pixel_clip_bb.Min.x);
      ImVec2::ImVec2(&local_80,fVar2,
                     (bb->Min).y + fStack_10 +
                     (float)(int)(*(float *)((long)label_size + 0x1928) * -0.25));
      local_88 = operator-(&bb->Max,(ImVec2 *)((long)&draw_list_local + 4));
      text = text_pixel_clip_bb.Max;
      ImVec2::ImVec2(&text_ellipsis_clip_bb.Max,0.0,0.0);
      RenderTextClippedEx(draw_list,&local_80,&local_88,(char *)text,(char *)0x0,(ImVec2 *)0x0,
                          &text_ellipsis_clip_bb.Max,(ImRect *)0x0);
    }
    last_item_backup.LastItemDisplayRect.Max.y = (float)local_70._0_4_;
    fStack_9c = (float)local_70._4_4_;
    text_ellipsis_clip_bb.Min.y = text_pixel_clip_bb.Min.y;
    text_ellipsis_clip_bb.Min.x = text_pixel_clip_bb.Min.x;
    last_item_backup.LastItemDisplayRect.Max.x._3_1_ = 0;
    last_item_backup.LastItemDisplayRect.Max.x._2_1_ = 0;
    if (((close_button_id != 0) &&
        ((is_contents_visible ||
         (fVar2 = ImRect::GetWidth(bb), *(float *)((long)label_size + 0x15e8) <= fVar2)))) &&
       ((*(ImGuiID *)((long)label_size + 0x1ab4) == tab_id ||
        ((*(ImGuiID *)((long)label_size + 0x1ab4) == close_button_id ||
         (*(ImGuiID *)((long)label_size + 0x1ac8) == close_button_id)))))) {
      last_item_backup.LastItemDisplayRect.Max.x._2_1_ = 1;
    }
    if ((last_item_backup.LastItemDisplayRect.Max.x._2_1_ & 1) != 0) {
      ImGuiItemHoveredDataBackup::ImGuiItemHoveredDataBackup((ImGuiItemHoveredDataBackup *)local_cc)
      ;
      local_d0 = *(float *)((long)label_size + 0x1928);
      PushStyleVar(10,(ImVec2 *)((long)&draw_list_local + 4));
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff28,
                     (-draw_list_local._4_4_ + -draw_list_local._4_4_ + (bb->Max).x) - local_d0,
                     (bb->Min).y);
      bVar1 = CloseButton(close_button_id,(ImVec2 *)&stack0xffffffffffffff28);
      if (bVar1) {
        last_item_backup.LastItemDisplayRect.Max.x._3_1_ = 1;
      }
      PopStyleVar(1);
      ImGuiItemHoveredDataBackup::Restore((ImGuiItemHoveredDataBackup *)local_cc);
      if (((flags & 4U) == 0) && (bVar1 = IsMouseClicked(2,false), bVar1)) {
        last_item_backup.LastItemDisplayRect.Max.x._3_1_ = 1;
      }
      text_pixel_clip_bb.Min.x = text_pixel_clip_bb.Min.x - local_d0;
    }
    if ((last_item_backup.LastItemDisplayRect.Max.x._2_1_ & 1) == 0) {
      local_f8 = (bb->Max).x - 1.0;
    }
    else {
      local_f8 = text_pixel_clip_bb.Min.x;
    }
    RenderTextEllipsis(draw_list,(ImVec2 *)&last_item_backup.LastItemDisplayRect.Max.y,
                       &text_ellipsis_clip_bb.Min,text_pixel_clip_bb.Min.x,local_f8,label,
                       (char *)0x0,(ImVec2 *)&TAB_UNSAVED_MARKER);
    frame_padding_local.x._3_1_ = (bool)(last_item_backup.LastItemDisplayRect.Max.x._3_1_ & 1);
  }
  return frame_padding_local.x._3_1_;
}

Assistant:

bool ImGui::TabItemLabelAndCloseButton(ImDrawList* draw_list, const ImRect& bb, ImGuiTabItemFlags flags, ImVec2 frame_padding, const char* label, ImGuiID tab_id, ImGuiID close_button_id, bool is_contents_visible)
{
    ImGuiContext& g = *GImGui;
    ImVec2 label_size = CalcTextSize(label, NULL, true);
    if (bb.GetWidth() <= 1.0f)
        return false;

    // In Style V2 we'll have full override of all colors per state (e.g. focused, selected)
    // But right now if you want to alter text color of tabs this is what you need to do.
#if 0
    const float backup_alpha = g.Style.Alpha;
    if (!is_contents_visible)
        g.Style.Alpha *= 0.7f;
#endif

    // Render text label (with clipping + alpha gradient) + unsaved marker
    const char* TAB_UNSAVED_MARKER = "*";
    ImRect text_pixel_clip_bb(bb.Min.x + frame_padding.x, bb.Min.y + frame_padding.y, bb.Max.x - frame_padding.x, bb.Max.y);
    if (flags & ImGuiTabItemFlags_UnsavedDocument)
    {
        text_pixel_clip_bb.Max.x -= CalcTextSize(TAB_UNSAVED_MARKER, NULL, false).x;
        ImVec2 unsaved_marker_pos(ImMin(bb.Min.x + frame_padding.x + label_size.x + 2, text_pixel_clip_bb.Max.x), bb.Min.y + frame_padding.y + IM_FLOOR(-g.FontSize * 0.25f));
        RenderTextClippedEx(draw_list, unsaved_marker_pos, bb.Max - frame_padding, TAB_UNSAVED_MARKER, NULL, NULL);
    }
    ImRect text_ellipsis_clip_bb = text_pixel_clip_bb;

    // Close Button
    // We are relying on a subtle and confusing distinction between 'hovered' and 'g.HoveredId' which happens because we are using ImGuiButtonFlags_AllowOverlapMode + SetItemAllowOverlap()
    //  'hovered' will be true when hovering the Tab but NOT when hovering the close button
    //  'g.HoveredId==id' will be true when hovering the Tab including when hovering the close button
    //  'g.ActiveId==close_button_id' will be true when we are holding on the close button, in which case both hovered booleans are false
    bool close_button_pressed = false;
    bool close_button_visible = false;
    if (close_button_id != 0)
        if (is_contents_visible || bb.GetWidth() >= g.Style.TabMinWidthForUnselectedCloseButton)
            if (g.HoveredId == tab_id || g.HoveredId == close_button_id || g.ActiveId == close_button_id)
                close_button_visible = true;
    if (close_button_visible)
    {
        ImGuiItemHoveredDataBackup last_item_backup;
        const float close_button_sz = g.FontSize;
        PushStyleVar(ImGuiStyleVar_FramePadding, frame_padding);
        if (CloseButton(close_button_id, ImVec2(bb.Max.x - frame_padding.x * 2.0f - close_button_sz, bb.Min.y)))
            close_button_pressed = true;
        PopStyleVar();
        last_item_backup.Restore();

        // Close with middle mouse button
        if (!(flags & ImGuiTabItemFlags_NoCloseWithMiddleMouseButton) && IsMouseClicked(2))
            close_button_pressed = true;

        text_pixel_clip_bb.Max.x -= close_button_sz;
    }

    float ellipsis_max_x = close_button_visible ? text_pixel_clip_bb.Max.x : bb.Max.x - 1.0f;
    RenderTextEllipsis(draw_list, text_ellipsis_clip_bb.Min, text_ellipsis_clip_bb.Max, text_pixel_clip_bb.Max.x, ellipsis_max_x, label, NULL, &label_size);

#if 0
    if (!is_contents_visible)
        g.Style.Alpha = backup_alpha;
#endif

    return close_button_pressed;
}